

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktSynchronizationUtil.cpp
# Opt level: O0

void __thiscall
vkt::synchronization::PipelineCacheData::setFromPipelineCache
          (PipelineCacheData *this,DeviceInterface *vk,VkDevice device,VkPipelineCache pipelineCache
          )

{
  ScopedLock SVar1;
  VkResult VVar2;
  reference pvVar3;
  size_type local_38;
  deUintptr dataSize;
  ScopedLock dataLock;
  VkDevice device_local;
  DeviceInterface *vk_local;
  PipelineCacheData *this_local;
  VkPipelineCache pipelineCache_local;
  
  dataLock.m_mutex = (Mutex *)device;
  de::ScopedLock::ScopedLock((ScopedLock *)&dataSize,&this->m_lock);
  local_38 = 0;
  VVar2 = (*vk->_vptr_DeviceInterface[0x2e])
                    (vk,dataLock.m_mutex,pipelineCache.m_internal,&local_38,0);
  ::vk::checkResult(VVar2,"vk.getPipelineCacheData(device, pipelineCache, &dataSize, DE_NULL)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationUtil.cpp"
                    ,0x351);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(&this->m_data,local_38);
  SVar1 = dataLock;
  if (local_38 != 0) {
    pvVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&this->m_data,0)
    ;
    VVar2 = (*vk->_vptr_DeviceInterface[0x2e])
                      (vk,SVar1.m_mutex,pipelineCache.m_internal,&local_38,pvVar3);
    ::vk::checkResult(VVar2,"vk.getPipelineCacheData(device, pipelineCache, &dataSize, &m_data[0])",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/synchronization/vktSynchronizationUtil.cpp"
                      ,0x356);
  }
  de::ScopedLock::~ScopedLock((ScopedLock *)&dataSize);
  return;
}

Assistant:

void PipelineCacheData::setFromPipelineCache (const vk::DeviceInterface& vk, const vk::VkDevice device, const vk::VkPipelineCache pipelineCache)
{
	const de::ScopedLock		dataLock		(m_lock);
	deUintptr					dataSize		= 0;

	VK_CHECK(vk.getPipelineCacheData(device, pipelineCache, &dataSize, DE_NULL));

	m_data.resize(dataSize);

	if (dataSize > 0)
		VK_CHECK(vk.getPipelineCacheData(device, pipelineCache, &dataSize, &m_data[0]));
}